

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_data.c
# Opt level: O2

int cmd_data_store(ly_ctx **ctx,yl_opt *yo,char *posv)

{
  int iVar1;
  cmdline_file *pcVar2;
  int iVar3;
  LYD_FORMAT format_data;
  ly_in *in;
  
  if (posv != (char *)0x0) {
    format_data = yo->data_in_format;
    iVar3 = 0;
    iVar1 = get_input(posv,(LYS_INFORMAT *)0x0,&format_data,&in);
    if (iVar1 == 0) {
      pcVar2 = fill_cmdline_file(&yo->data_inputs,in,posv,format_data);
      if (pcVar2 == (cmdline_file *)0x0) {
        iVar3 = 1;
        ly_in_free(in,1);
      }
    }
    else {
      iVar3 = 1;
    }
    return iVar3;
  }
  __assert_fail("posv",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/tools/lint/cmd_data.c"
                ,0x167,"int cmd_data_store(struct ly_ctx **, struct yl_opt *, const char *)");
}

Assistant:

int
cmd_data_store(struct ly_ctx **ctx, struct yl_opt *yo, const char *posv)
{
    (void) ctx;
    struct ly_in *in;
    LYD_FORMAT format_data;

    assert(posv);

    format_data = yo->data_in_format;

    /* process input data files provided as standalone command line arguments */
    if (get_input(posv, NULL, &format_data, &in)) {
        return 1;
    }

    if (!fill_cmdline_file(&yo->data_inputs, in, posv, format_data)) {
        ly_in_free(in, 1);
        return 1;
    }

    return 0;
}